

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O0

void __thiscall ByteData160_Concat_Test::TestBody(ByteData160_Concat_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1a8;
  Message local_1a0;
  string local_198;
  undefined1 local_178 [8];
  AssertionResult gtest_ar;
  Message local_160 [2];
  ByteData local_150;
  undefined1 local_138 [8];
  ByteData result;
  string local_118;
  undefined1 local_f8 [8];
  ByteData256 data3;
  string local_d8;
  undefined1 local_b8 [8];
  ByteData160 data2;
  string local_98;
  undefined1 local_78 [8];
  ByteData data1;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData160 base;
  ByteData160_Concat_Test *this_local;
  
  base.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"1111111111111111111111111111111111111111",&local_49);
  cfd::core::ByteData160::ByteData160((ByteData160 *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"2233",
             (allocator *)
             ((long)&data2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&data2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,"4444444444444444444444444444444444444444",
             (allocator *)
             ((long)&data3.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData160::ByteData160((ByteData160 *)local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&data3.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,"5555555555555555555555555555555555555555555555555555555555555555"
             ,(allocator *)
              ((long)&result.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_f8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&result.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_138);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData160::
      Concat<cfd::core::ByteData,cfd::core::ByteData160,cfd::core::ByteData256>
                (&local_150,(ByteData160 *)local_28,(ByteData *)local_78,(ByteData160 *)local_b8,
                 (ByteData256 *)local_f8);
      cfd::core::ByteData::operator=((ByteData *)local_138,&local_150);
      cfd::core::ByteData::~ByteData(&local_150);
    }
  }
  else {
    testing::Message::Message(local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x9b,
               "Expected: result = base.Concat(data1, data2, data3) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_160);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_198,(ByteData *)local_138);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_178,"result.GetHex().c_str()",
             "\"1111111111111111111111111111111111111111223344444444444444444444444444444444444444445555555555555555555555555555555555555555555555555555555555555555\""
             ,pcVar2,
             "1111111111111111111111111111111111111111223344444444444444444444444444444444444444445555555555555555555555555555555555555555555555555555555555555555"
            );
  std::__cxx11::string::~string((string *)&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x9c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  cfd::core::ByteData::~ByteData((ByteData *)local_138);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_f8);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)local_b8);
  cfd::core::ByteData::~ByteData((ByteData *)local_78);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)local_28);
  return;
}

Assistant:

TEST(ByteData160, Concat) {
  ByteData160 base("1111111111111111111111111111111111111111");
  ByteData data1("2233");
  ByteData160 data2("4444444444444444444444444444444444444444");
  ByteData256 data3("5555555555555555555555555555555555555555555555555555555555555555");
  ByteData result;

  EXPECT_NO_THROW(result = base.Concat(data1, data2, data3));
  EXPECT_STREQ(result.GetHex().c_str(), "1111111111111111111111111111111111111111223344444444444444444444444444444444444444445555555555555555555555555555555555555555555555555555555555555555");
}